

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::
Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::unregister(Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uniqKey)

{
  int iVar1;
  undefined4 extraout_var;
  Logger *local_20;
  Logger *existing;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uniqKey_local;
  Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  existing = (Logger *)uniqKey;
  uniqKey_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  local_20 = get(this,uniqKey);
  if (local_20 != (Logger *)0x0) {
    iVar1 = (*(this->
              super_AbstractRegistry<el::Logger,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[0xb])();
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>
    ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>
             *)CONCAT44(extraout_var,iVar1),(key_type *)existing);
    safeDelete<el::Logger>(&local_20);
  }
  return;
}

Assistant:

void unregister(const T_Key& uniqKey) {
    T_Ptr* existing = get(uniqKey);
    if (existing != nullptr) {
      this->list().erase(uniqKey);
      base::utils::safeDelete(existing);
    }
  }